

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strategy.cpp
# Opt level: O2

void __thiscall Strategy::Strategy(Strategy *this,StrategyConfig *config)

{
  CFGsContainer **ppCVar1;
  char cVar2;
  CFGsContainer *pCVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  
  this->_vptr_Strategy = (_func_int **)&PTR__Strategy_00118d18;
  StrategyConfig::StrategyConfig(&this->m_config,config);
  this->m_a = (CFGsContainer *)0x0;
  this->m_b = (CFGsContainer *)0x0;
  std::ofstream::ofstream(&this->m_fout);
  if (config->instrs != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_50,config->instrs,(allocator *)&local_90);
    Instruction::load(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pCVar3 = (CFGsContainer *)operator_new(0x298);
  std::__cxx11::string::string((string *)&local_90,config->input1,&local_91);
  std::__cxx11::string::string((string *)&local_70,"A",&local_92);
  CFGsContainer::CFGsContainer(pCVar3,&local_90,&local_70);
  ppCVar1 = &this->m_a;
  *ppCVar1 = pCVar3;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  pCVar3 = (CFGsContainer *)operator_new(0x298);
  std::__cxx11::string::string((string *)&local_90,config->input2,&local_91);
  std::__cxx11::string::string((string *)&local_70,"B",&local_92);
  CFGsContainer::CFGsContainer(pCVar3,&local_90,&local_70);
  this->m_b = pCVar3;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  if (config->compress == true) {
    CFGsContainer::compressAll(*ppCVar1);
    CFGsContainer::compressAll(this->m_b);
  }
  CFGsContainer::checkAll(*ppCVar1);
  CFGsContainer::checkAll(this->m_b);
  if (config->dump != (char *)0x0) {
    CFGsContainer::dumpAll(*ppCVar1,config->dump);
    CFGsContainer::dumpAll(this->m_b,config->dump);
  }
  if (config->output != (char *)0x0) {
    std::ofstream::open((char *)&this->m_fout,(_Ios_Openmode)config->output);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&local_90,"Unable to open output file: ",(allocator *)&local_70);
      std::operator+(__return_storage_ptr__,&local_90,config->output);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  return;
}

Assistant:

Strategy::Strategy(const StrategyConfig& config) : m_config(config), m_a(0), m_b(0) {
	if (config.instrs)
		Instruction::load(std::string(config.instrs));

	m_a = new CFGsContainer((std::string(config.input1)), "A");
	m_b = new CFGsContainer((std::string(config.input2)), "B");

	if (config.compress) {
		m_a->compressAll();
		m_b->compressAll();
	}

	m_a->checkAll();
	m_b->checkAll();

	if (config.dump) {
		m_a->dumpAll(config.dump);
		m_b->dumpAll(config.dump);
	}

	if (config.output) {
		m_fout.open(config.output);
		if (!m_fout.is_open())
			throw std::string("Unable to open output file: ") + config.output;
	}
}